

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType TVar1;
  Type TVar2;
  char *pcVar3;
  allocator *paVar4;
  string *psVar5;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  TVar1 = this->token_type_;
  if ((ulong)TVar1 < 0x26) {
    pcVar3 = GetTokenTypeName::s_names[TVar1];
    paVar4 = &local_13;
    goto LAB_00d9e6ca;
  }
  if (TVar1 - First_Literal < 3) {
    psVar5 = (string *)&(this->field_2).literal_.text;
LAB_00d9e6dd:
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar5);
    return __return_storage_ptr__;
  }
  if (TVar1 - AtomicLoad < 0x34) {
    pcVar3 = Opcode::GetName(&(this->field_2).opcode_);
    paVar4 = &local_12;
    goto LAB_00d9e6ca;
  }
  if (TVar1 - AlignEqNat < 5) {
    psVar5 = (string *)&this->field_2;
    goto LAB_00d9e6dd;
  }
  if (TVar1 != First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.cc"
                  ,0x92,"std::string wabt::Token::to_string() const");
  }
  TVar2 = (this->field_2).type_;
  switch(TVar2) {
  case Any:
    pcVar3 = "any";
    break;
  case Anyfunc:
    pcVar3 = "anyfunc";
    break;
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case 0xfffffff4:
  case 0xfffffff5:
  case 0xfffffff6:
  case 0xfffffff7:
  case 0xfffffff8:
  case 0xfffffff9:
  case 0xfffffffa:
switchD_00d9e73f_caseD_fffffff1:
    pcVar3 = "<type index>";
    break;
  case V128:
    pcVar3 = "v128";
    break;
  case F64:
    pcVar3 = "f64";
    break;
  case F32:
    pcVar3 = "f32";
    break;
  case I64:
    pcVar3 = "i64";
    break;
  case I32:
    pcVar3 = "i32";
    break;
  default:
    if (TVar2 == Void) {
      pcVar3 = "void";
    }
    else if (TVar2 == Func) {
      pcVar3 = "func";
    }
    else {
      if (TVar2 != ExceptRef) goto switchD_00d9e73f_caseD_fffffff1;
      pcVar3 = "except_ref";
    }
  }
  paVar4 = &local_11;
LAB_00d9e6ca:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return literal_.text;
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return text_;
  } else {
    assert(HasType());
    return GetTypeName(type_);
  }
}